

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_BXJ(DisasContext_conflict1 *s,arg_BXJ *a)

{
  _Bool _Var1;
  TCGv_i32 var;
  
  if ((s->isar->id_isar1 < 0x10000000) || ((s->features & 0x200) != 0)) {
    _Var1 = false;
  }
  else {
    var = load_reg(s,a->rm);
    gen_bx(s,var);
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

static bool trans_BXJ(DisasContext *s, arg_BXJ *a)
{
    if (!ENABLE_ARCH_5J || arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    /* Trivial implementation equivalent to bx.  */
    gen_bx(s, load_reg(s, a->rm));
    return true;
}